

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_fp_fcvt(DisasContext_conflict1 *s,int opcode,int rd,int rn,int dtype,int ntype)

{
  TCGContext_conflict1 *s_00;
  TCGv_i32 ret;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  uintptr_t o_3;
  TCGv_i32 pTVar4;
  uintptr_t o_7;
  uintptr_t o;
  TCGTemp *args [2];
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  if (dtype == 3) {
    pTVar4 = read_fp_sreg((DisasContext_conflict1 *)s_00,rd);
    pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar2 - (long)s_00);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar2,(TCGArg)(s_00->cpu_env + (long)s_00),
                        0x2e6c);
    tcg_gen_extract_i32_aarch64(s_00,ret,ret,0x1a,1);
    tcg_gen_ext16u_i32_aarch64(s_00,pTVar4,pTVar4);
    pTVar2 = (TCGTemp *)(pTVar4 + (long)s_00);
    local_48 = pTVar2;
    local_40 = pTVar1;
    if (rn == 0) {
      pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      local_38 = (TCGTemp *)((long)s_00 + (long)ret);
      tcg_gen_callN_aarch64(s_00,helper_vfp_fcvt_f16_to_f32_aarch64,pTVar3,3,&local_48);
      write_fp_sreg(s,opcode,(TCGv_i32)((long)pTVar3 - (long)s_00));
    }
    else {
      pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      local_38 = (TCGTemp *)((long)s_00 + (long)ret);
      tcg_gen_callN_aarch64(s_00,helper_vfp_fcvt_f16_to_f64_aarch64,pTVar3,3,&local_48);
      write_fp_dreg_aarch64(s,opcode,(TCGv_i64)((long)pTVar3 - (long)s_00));
    }
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,pTVar2);
    tcg_temp_free_internal_aarch64
              (s_00,(TCGTemp *)((TCGv_i64)((long)pTVar1 - (long)s_00) + (long)s_00));
  }
  else {
    if (dtype == 1) {
      ret = (TCGv_i32)read_fp_dreg((DisasContext_conflict1 *)s_00,rd);
      pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar4 = (TCGv_i32)((long)pTVar1 - (long)s_00);
      if (rn == 0) {
        local_40 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
        local_48 = (TCGTemp *)((TCGv_i64)ret + (long)&s_00->pool_cur);
        tcg_gen_callN_aarch64
                  (s_00,helper_vfp_fcvtsd_aarch64,(TCGTemp *)((long)s_00 + (long)pTVar4),2,&local_48
                  );
      }
      else {
        pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        tcg_gen_addi_i64_aarch64
                  (s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
        pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar2,(TCGArg)(s_00->cpu_env + (long)s_00)
                            ,0x2e6c);
        tcg_gen_extract_i32_aarch64
                  (s_00,(TCGv_i32)((long)pTVar2 - (long)s_00),(TCGv_i32)((long)pTVar2 - (long)s_00),
                   0x1a,1);
        local_48 = (TCGTemp *)((TCGv_i64)ret + (long)&s_00->pool_cur);
        local_40 = pTVar1;
        local_38 = pTVar2;
        tcg_gen_callN_aarch64
                  (s_00,helper_vfp_fcvt_f64_to_f16_aarch64,(TCGTemp *)((long)s_00 + (long)pTVar4),3,
                   &local_48);
        tcg_temp_free_internal_aarch64(s_00,pTVar1);
        tcg_temp_free_internal_aarch64(s_00,pTVar2);
      }
      write_fp_sreg(s,opcode,pTVar4);
      pTVar1 = (TCGTemp *)(pTVar4 + (long)s_00);
    }
    else {
      if (dtype != 0) {
        abort();
      }
      ret = read_fp_sreg((DisasContext_conflict1 *)s_00,rd);
      if (rn == 1) {
        pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        local_40 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
        local_48 = (TCGTemp *)(ret + (long)&s_00->pool_cur);
        tcg_gen_callN_aarch64(s_00,helper_vfp_fcvtds_aarch64,pTVar1,2,&local_48);
        write_fp_dreg_aarch64(s,opcode,(TCGv_i64)((long)pTVar1 - (long)s_00));
      }
      else {
        pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar3,(TCGArg)(s_00->cpu_env + (long)s_00)
                            ,0x2e6c);
        tcg_gen_extract_i32_aarch64
                  (s_00,(TCGv_i32)((long)pTVar3 - (long)s_00),(TCGv_i32)((long)pTVar3 - (long)s_00),
                   0x1a,1);
        pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
        tcg_gen_addi_i64_aarch64
                  (s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
        local_48 = (TCGTemp *)(ret + (long)&s_00->pool_cur);
        local_40 = pTVar1;
        local_38 = pTVar3;
        tcg_gen_callN_aarch64(s_00,helper_vfp_fcvt_f32_to_f16_aarch64,pTVar2,3,&local_48);
        write_fp_sreg(s,opcode,(TCGv_i32)((long)pTVar2 - (long)s_00));
        tcg_temp_free_internal_aarch64(s_00,pTVar2);
        tcg_temp_free_internal_aarch64(s_00,pTVar3);
      }
    }
    tcg_temp_free_internal_aarch64(s_00,pTVar1);
  }
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void handle_fp_fcvt(DisasContext *s, int opcode,
                           int rd, int rn, int dtype, int ntype)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (ntype) {
    case 0x0:
    {
        TCGv_i32 tcg_rn = read_fp_sreg(s, rn);
        if (dtype == 1) {
            /* Single to double */
            TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);
            gen_helper_vfp_fcvtds(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
            write_fp_dreg(s, rd, tcg_rd);
            tcg_temp_free_i64(tcg_ctx, tcg_rd);
        } else {
            /* Single to half */
            TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 ahp = get_ahp_flag(tcg_ctx);
            TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

            gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_rd, tcg_rn, fpst, ahp);
            /* write_fp_sreg is OK here because top half of tcg_rd is zero */
            write_fp_sreg(s, rd, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, ahp);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
        break;
    }
    case 0x1:
    {
        TCGv_i64 tcg_rn = read_fp_dreg(s, rn);
        TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
        if (dtype == 0) {
            /* Double to single */
            gen_helper_vfp_fcvtsd(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
        } else {
            TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
            TCGv_i32 ahp = get_ahp_flag(tcg_ctx);
            /* Double to half */
            gen_helper_vfp_fcvt_f64_to_f16(tcg_ctx, tcg_rd, tcg_rn, fpst, ahp);
            /* write_fp_sreg is OK here because top half of tcg_rd is zero */
            tcg_temp_free_ptr(tcg_ctx, fpst);
            tcg_temp_free_i32(tcg_ctx, ahp);
        }
        write_fp_sreg(s, rd, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rn);
        break;
    }
    case 0x3:
    {
        TCGv_i32 tcg_rn = read_fp_sreg(s, rn);
        TCGv_ptr tcg_fpst = get_fpstatus_ptr(tcg_ctx, false);
        TCGv_i32 tcg_ahp = get_ahp_flag(tcg_ctx);
        tcg_gen_ext16u_i32(tcg_ctx, tcg_rn, tcg_rn);
        if (dtype == 0) {
            /* Half to single */
            TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
            gen_helper_vfp_fcvt_f16_to_f32(tcg_ctx, tcg_rd, tcg_rn, tcg_fpst, tcg_ahp);
            write_fp_sreg(s, rd, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, tcg_rd);
        } else {
            /* Half to double */
            TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);
            gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx, tcg_rd, tcg_rn, tcg_fpst, tcg_ahp);
            write_fp_dreg(s, rd, tcg_rd);
            tcg_temp_free_i64(tcg_ctx, tcg_rd);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
        tcg_temp_free_ptr(tcg_ctx, tcg_fpst);
        tcg_temp_free_i32(tcg_ctx, tcg_ahp);
        break;
    }
    default:
        abort();
    }
}